

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O2

void rw::wdgl::uninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  byte *pbVar1;
  AttribDesc *a;
  Geometry *this;
  Atomic *pAVar2;
  void *pvVar3;
  _func_void_ObjPipeline_ptr_Atomic_ptr *p_Var4;
  char cVar5;
  short sVar9;
  short sVar10;
  short sVar11;
  uint32 uVar12;
  int32 extraout_EDX;
  long lVar13;
  int32 i;
  int iVar14;
  uint8 *src;
  int32 iVar15;
  long lVar16;
  TexCoords *dst;
  V3d *dst_00;
  V3d *dst_01;
  bool bVar17;
  short sVar18;
  int iVar19;
  int iVar22;
  int iVar23;
  int iVar24;
  float32 f [4];
  RGBA *local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined4 uVar20;
  undefined6 uVar21;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) != 0) {
    uVar12 = MeshHeader::guessNumTriangles(this->meshHeader);
    this->numTriangles = uVar12;
    Geometry::allocateData(this);
    local_58 = this->colors;
    dst = this->texCoords[0];
    dst_00 = this->morphTargets->vertices;
    dst_01 = this->morphTargets->normals;
    pAVar2 = (Atomic *)this->instData;
    for (lVar16 = 0; lVar16 < *(int *)&(pAVar2->object).object.field_0x4; lVar16 = lVar16 + 1) {
      pvVar3 = (pAVar2->object).object.parent;
      lVar13 = lVar16 * 0x18;
      if (*(uint *)((long)pvVar3 + lVar13) < 4) {
        a = (AttribDesc *)((long)pvVar3 + lVar13);
        src = (uint8 *)((long)&((pAVar2->object).inFrame.prev)->next +
                       (ulong)*(uint *)((long)pvVar3 + lVar13 + 0x14));
        switch(*(uint *)((long)pvVar3 + lVar13)) {
        case 0:
          for (iVar14 = 0; iVar14 < this->numVertices; iVar14 = iVar14 + 1) {
            unpackattrib((float *)dst_00,src,a,1.0);
            dst_00 = dst_00 + 1;
            src = src + a->stride;
          }
          break;
        case 1:
          for (iVar14 = 0; iVar14 < this->numVertices; iVar14 = iVar14 + 1) {
            unpackattrib((float *)dst,src,a,512.0);
            dst = dst + 1;
            src = src + a->stride;
          }
          break;
        case 2:
          for (iVar14 = 0; iVar14 < this->numVertices; iVar14 = iVar14 + 1) {
            unpackattrib((float *)dst_01,src,a,1.0);
            dst_01 = dst_01 + 1;
            src = src + a->stride;
          }
          break;
        case 3:
          iVar14 = this->numVertices;
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          while (bVar17 = iVar14 != 0, iVar14 = iVar14 + -1, bVar17) {
            unpackattrib(&local_48,src,a,1.0);
            iVar19 = (int)(local_48 * 255.0);
            iVar22 = (int)(fStack_44 * 255.0);
            iVar23 = (int)(fStack_40 * 255.0);
            iVar24 = (int)(fStack_3c * 255.0);
            sVar9 = (short)iVar19;
            cVar5 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar19 - (0xff < sVar9);
            sVar9 = (short)((uint)iVar19 >> 0x10);
            sVar18 = CONCAT11((0 < sVar9) * (sVar9 < 0x100) * (char)((uint)iVar19 >> 0x10) -
                              (0xff < sVar9),cVar5);
            sVar9 = (short)iVar22;
            cVar6 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar22 - (0xff < sVar9);
            sVar9 = (short)((uint)iVar22 >> 0x10);
            uVar20 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * (char)((uint)iVar22 >> 0x10) -
                              (0xff < sVar9),CONCAT12(cVar6,sVar18));
            sVar9 = (short)iVar23;
            cVar7 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar23 - (0xff < sVar9);
            sVar9 = (short)((uint)iVar23 >> 0x10);
            uVar21 = CONCAT15((0 < sVar9) * (sVar9 < 0x100) * (char)((uint)iVar23 >> 0x10) -
                              (0xff < sVar9),CONCAT14(cVar7,uVar20));
            sVar9 = (short)iVar24;
            cVar8 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar24 - (0xff < sVar9);
            sVar11 = (short)((uint)iVar24 >> 0x10);
            sVar9 = (short)((uint)uVar20 >> 0x10);
            sVar10 = (short)((uint6)uVar21 >> 0x20);
            sVar11 = (short)(CONCAT17((0 < sVar11) * (sVar11 < 0x100) * (char)((uint)iVar24 >> 0x10)
                                      - (0xff < sVar11),CONCAT16(cVar8,uVar21)) >> 0x30);
            local_58->red = (0 < sVar18) * (sVar18 < 0x100) * cVar5 - (0xff < sVar18);
            local_58->green = (0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9);
            local_58->blue = (0 < sVar10) * (sVar10 < 0x100) * cVar7 - (0xff < sVar10);
            local_58->alpha = (0 < sVar11) * (sVar11 < 0x100) * cVar8 - (0xff < sVar11);
            local_58 = local_58 + 1;
            src = src + a->stride;
          }
        }
      }
    }
    p_Var4 = rwpipe[1].impl.instance;
    if (p_Var4 != (_func_void_ObjPipeline_ptr_Atomic_ptr *)0x0) {
      (*p_Var4)((ObjPipeline *)this,pAVar2);
    }
    iVar15 = 0;
    Geometry::generateTriangles(this,(int8 *)0x0);
    pbVar1 = (byte *)((long)&this->flags + 3);
    *pbVar1 = *pbVar1 & 0xfe;
    destroyNativeData(this,iVar15,extraout_EDX);
  }
  return;
}

Assistant:

static void
uninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_WDGL);
	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();

	uint8 *p;
	TexCoords *texcoord = geo->texCoords[0];
	RGBA *color = geo->colors;
	V3d *vert = geo->morphTargets->vertices;
	V3d *norm = geo->morphTargets->normals;
	float32 f[4];

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	for(int i = 0; i < header->numAttribs; i++){
		AttribDesc *a = &header->attribs[i];
		p = header->data + a->offset;

		switch(a->index){
		case 0:		// Vertices
			for(int32 i = 0; i < geo->numVertices; i++){
				unpackattrib((float32*)vert, p, a);
				vert++;
				p += a->stride;
			}
			break;

		case 1:		// texCoords
			for(int32 i = 0; i < geo->numVertices; i++){
				unpackattrib((float32*)texcoord, p, a, 512.0f);
				texcoord++;
				p += a->stride;
			}
			break;

		case 2:		// normals
			for(int32 i = 0; i < geo->numVertices; i++){
				unpackattrib((float32*)norm, p, a);
				norm++;
				p += a->stride;
			}
			break;

		case 3:		// colors
			for(int32 i = 0; i < geo->numVertices; i++){
				// TODO: this seems too complicated
				unpackattrib(f, p, a);
				color->red   = f[0]*255.0f;
				color->green = f[1]*255.0f;
				color->blue  = f[2]*255.0f;
				color->alpha = f[3]*255.0f;
				color++;
				p += a->stride;
			}
			break;
		}
	}

	if(pipe->uninstanceCB)
		pipe->uninstanceCB(geo);

	geo->generateTriangles();

	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
}